

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcess.cpp
# Opt level: O1

void __thiscall
MultiAgentDecisionProcess::~MultiAgentDecisionProcess(MultiAgentDecisionProcess *this,void **vtt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *pvVar2;
  pointer pcVar3;
  pointer puVar4;
  
  pvVar2 = *vtt;
  *(void **)this = pvVar2;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar2 + -0x40)) = vtt[1];
  (this->_m_problemFile)._M_string_length = 0;
  *(this->_m_problemFile)._M_dataplus._M_p = '\0';
  pcVar3 = (this->_m_unixName)._M_dataplus._M_p;
  paVar1 = &(this->_m_unixName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->_m_problemFile)._M_dataplus._M_p;
  paVar1 = &(this->_m_problemFile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  puVar4 = (this->_m_allAgentsScope).super_SDT.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->_m_allAgentsScope).super_SDT.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  std::vector<Agent,_std::allocator<Agent>_>::~vector(&this->_m_agents);
  NamedDescribedEntity::~NamedDescribedEntity(&this->_m_name);
  return;
}

Assistant:

MultiAgentDecisionProcess::~MultiAgentDecisionProcess()
{
    _m_problemFile.clear();
}